

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

void doSanityChecks(Section *section,void *ptr)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ushort uVar5;
  undefined8 in_RAX;
  ulong uVar6;
  ushort uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  
  uVar9 = (undefined4)((ulong)in_RAX >> 0x20);
  if (SECTTYPE_OAM < section->type) {
    error((FileStackNode *)0x0,0,"Section \"%s\" has an invalid type",section->name);
    return;
  }
  if ((section->type == SECTTYPE_ROMX) && (is32kMode)) {
    if ((section->isBankFixed == true) && (section->bank != 1)) {
      error((FileStackNode *)0x0,0,"%s: ROMX sections must be in bank 1 (if any) with option -t",
            section->name);
    }
    else {
      section->type = SECTTYPE_ROM0;
    }
  }
  if ((isWRA0Mode == true) && (section->type == SECTTYPE_WRAMX)) {
    if ((section->isBankFixed == true) && (section->bank != 1)) {
      error((FileStackNode *)0x0,0,"%s: WRAMX sections must be in bank 1 with options -w or -d",
            section->name);
    }
    else {
      section->type = SECTTYPE_WRAM0;
    }
  }
  if (((isDmgMode == true) && (section->type == SECTTYPE_VRAM)) && (section->bank == 1)) {
    error((FileStackNode *)0x0,0,"%s: VRAM bank 1 can\'t be used with option -d",section->name);
  }
  if ((section->isAlignFixed == true) && (section->alignMask == 0)) {
    section->isAlignFixed = false;
  }
  else {
    uVar6 = (ulong)section->type;
    if ((section->isAlignFixed == false) ||
       ((sectionTypeInfo[uVar6].startAddr & section->alignMask) == 0)) goto LAB_0010a56b;
    error((FileStackNode *)0x0,0,"%s: %s sections cannot be aligned to $%04x bytes",section->name,
          sectionTypeInfo[uVar6].name,(ulong)(section->alignMask + 1));
  }
  uVar6 = (ulong)section->type;
LAB_0010a56b:
  uVar2 = sectionTypeInfo[uVar6].firstBank;
  uVar3 = sectionTypeInfo[uVar6].lastBank;
  if (section->isBankFixed == true) {
    uVar4 = section->bank;
    if (uVar3 < uVar4 && uVar4 < uVar2) {
      uVar8 = CONCAT44(uVar9,uVar3);
      error((FileStackNode *)0x0,0,
            "Cannot place section \"%s\" in bank %u, it must be between %u and %u",section->name,
            (ulong)uVar4,(ulong)uVar2,uVar8);
      uVar9 = (undefined4)((ulong)uVar8 >> 0x20);
      uVar6 = (ulong)section->type;
    }
  }
  if (sectionTypeInfo[uVar6].size < section->size) {
    error((FileStackNode *)0x0,0,
          "Section \"%s\" is bigger than the max size for that type: $%x > $%x",section->name);
  }
  if (uVar2 == uVar3) {
    section->bank = uVar2;
    section->isBankFixed = true;
  }
  if (section->isAddressFixed == true) {
    if (section->isAlignFixed == true) {
      if ((section->alignMask & section->org) != section->alignOfs) {
        error((FileStackNode *)0x0,0,"Section \"%s\"\'s fixed address doesn\'t match its alignment",
              section->name);
      }
      section->isAlignFixed = false;
    }
    uVar5 = section->org;
    uVar1 = sectionTypeInfo[section->type].startAddr;
    uVar7 = (sectionTypeInfo[section->type].size + uVar1) - 1;
    if (uVar7 < uVar5 || uVar5 < uVar1) {
      error((FileStackNode *)0x0,0,
            "Section \"%s\"\'s fixed address $%04x is outside of range [$%04x; $%04x]",section->name
            ,(ulong)uVar5,(ulong)uVar1,CONCAT44(uVar9,(uint)uVar7));
      uVar5 = section->org;
      uVar7 = (sectionTypeInfo[section->type].startAddr + sectionTypeInfo[section->type].size) - 1;
    }
    if (uVar7 + 1 < (uint)section->size + (uint)uVar5) {
      error((FileStackNode *)0x0,0,
            "Section \"%s\"\'s end address $%04x is greater than last address $%04x",section->name);
      return;
    }
  }
  return;
}

Assistant:

static void doSanityChecks(struct Section *section, void *ptr)
{
	(void)ptr;

	// Sanity check the section's type

	if (section->type < 0 || section->type >= SECTTYPE_INVALID) {
		error(NULL, 0, "Section \"%s\" has an invalid type", section->name);
		return;
	}

	if (is32kMode && section->type == SECTTYPE_ROMX) {
		if (section->isBankFixed && section->bank != 1)
			error(NULL, 0, "%s: ROMX sections must be in bank 1 (if any) with option -t",
			     section->name);
		else
			section->type = SECTTYPE_ROM0;
	}
	if (isWRA0Mode && section->type == SECTTYPE_WRAMX) {
		if (section->isBankFixed && section->bank != 1)
			error(NULL, 0, "%s: WRAMX sections must be in bank 1 with options -w or -d",
			     section->name);
		else
			section->type = SECTTYPE_WRAM0;
	}
	if (isDmgMode && section->type == SECTTYPE_VRAM && section->bank == 1)
		error(NULL, 0, "%s: VRAM bank 1 can't be used with option -d",
		     section->name);

	// Check if alignment is reasonable, this is important to avoid UB
	// An alignment of zero is equivalent to no alignment, basically
	if (section->isAlignFixed && section->alignMask == 0)
		section->isAlignFixed = false;

	// Too large an alignment may not be satisfiable
	if (section->isAlignFixed && (section->alignMask & sectionTypeInfo[section->type].startAddr))
		error(NULL, 0, "%s: %s sections cannot be aligned to $%04x bytes",
		     section->name, sectionTypeInfo[section->type].name, section->alignMask + 1);

	uint32_t minbank = sectionTypeInfo[section->type].firstBank, maxbank = sectionTypeInfo[section->type].lastBank;

	if (section->isBankFixed && section->bank < minbank && section->bank > maxbank)
		error(NULL, 0, minbank == maxbank
			? "Cannot place section \"%s\" in bank %" PRIu32 ", it must be %" PRIu32
			: "Cannot place section \"%s\" in bank %" PRIu32 ", it must be between %" PRIu32 " and %" PRIu32,
		     section->name, section->bank, minbank, maxbank);

	// Check if section has a chance to be placed
	if (section->size > sectionTypeInfo[section->type].size)
		error(NULL, 0, "Section \"%s\" is bigger than the max size for that type: $%"
		      PRIx16 " > $%" PRIx16,
		      section->name, section->size, sectionTypeInfo[section->type].size);

	// Translate loose constraints to strong ones when they're equivalent

	if (minbank == maxbank) {
		section->bank = minbank;
		section->isBankFixed = true;
	}

	if (section->isAddressFixed) {
		// It doesn't make sense to have both org and alignment set
		if (section->isAlignFixed) {
			if ((section->org & section->alignMask) != section->alignOfs)
				error(NULL, 0, "Section \"%s\"'s fixed address doesn't match its alignment",
				     section->name);
			section->isAlignFixed = false;
		}

		// Ensure the target address is valid
		if (section->org < sectionTypeInfo[section->type].startAddr
		 || section->org > endaddr(section->type))
			error(NULL, 0, "Section \"%s\"'s fixed address $%04" PRIx16 " is outside of range [$%04"
			     PRIx16 "; $%04" PRIx16 "]", section->name, section->org,
			     sectionTypeInfo[section->type].startAddr, endaddr(section->type));

		if (section->org + section->size > endaddr(section->type) + 1)
			error(NULL, 0, "Section \"%s\"'s end address $%04x is greater than last address $%04x",
			      section->name, section->org + section->size,
			      endaddr(section->type) + 1);
	}

#undef fail
}